

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O3

int Gli_ManCreateCi(Gli_Man_t *p,int nFanouts)

{
  int Entry;
  int *piVar1;
  
  Entry = p->iObjData;
  piVar1 = p->pObjData;
  piVar1[(long)Entry + 1] = Entry;
  piVar1[Entry] = nFanouts << 7 | piVar1[Entry] & 0xfU;
  p->iObjData = p->iObjData + (nFanouts & 0x1ffffffU) + 8;
  p->nObjs = p->nObjs + 1;
  *(byte *)(piVar1 + Entry) = *(byte *)(piVar1 + Entry) | 1;
  Vec_IntPush(p->vCis,Entry);
  return piVar1[(long)Entry + 1];
}

Assistant:

int Gli_ManCreateCi( Gli_Man_t * p, int nFanouts )
{
    Gli_Obj_t * pObj;
    pObj = Gli_ObjAlloc( p, 0, nFanouts );
    pObj->fTerm = 1;
    Vec_IntPush( p->vCis, pObj->Handle );
    return pObj->Handle;
}